

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O1

void __thiscall
QColumnViewPrivate::checkColumnCreation(QColumnViewPrivate *this,QModelIndex *parent)

{
  QAbstractItemModel *pQVar1;
  QAbstractItemView *this_00;
  char cVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  QModelIndex local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QAbstractItemView::currentIndex
            (&local_50,
             *(QAbstractItemView **)
              &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
               super_QFramePrivate.super_QWidgetPrivate.field_0x8);
  if ((((parent->r == local_50.r) && (parent->c == local_50.c)) &&
      (parent->i ==
       CONCAT17(local_50.i._7_1_,
                CONCAT16(local_50.i._6_1_,
                         CONCAT15(local_50.i._5_1_,
                                  CONCAT14(local_50.i._4_1_,
                                           CONCAT13(local_50.i._3_1_,
                                                    CONCAT12(local_50.i._2_1_,
                                                             CONCAT11(local_50.i._1_1_,
                                                                      (char)local_50.i))))))))) &&
     ((parent->m).ptr == local_50.m.ptr)) {
    pQVar1 = (this->super_QAbstractItemViewPrivate).model;
    cVar2 = (**(code **)(*(long *)pQVar1 + 0x88))(pQVar1,parent);
    if ((cVar2 != '\0') && ((this->columns).d.size != 0)) {
      uVar3 = 0;
      do {
        this_00 = (QAbstractItemView *)(this->columns).d.ptr[uVar3];
        QAbstractItemView::rootIndex(&local_50,this_00);
        auVar5[0] = -((char)parent->r == (char)local_50.r);
        auVar5[1] = -(*(char *)((long)&parent->r + 1) == local_50.r._1_1_);
        auVar5[2] = -(*(char *)((long)&parent->r + 2) == local_50.r._2_1_);
        auVar5[3] = -(*(char *)((long)&parent->r + 3) == local_50.r._3_1_);
        auVar5[4] = -((char)parent->c == (char)local_50.c);
        auVar5[5] = -(*(char *)((long)&parent->c + 1) == local_50.c._1_1_);
        auVar5[6] = -(*(char *)((long)&parent->c + 2) == local_50.c._2_1_);
        auVar5[7] = -(*(char *)((long)&parent->c + 3) == local_50.c._3_1_);
        auVar5[8] = -((char)parent->i == (char)local_50.i);
        auVar5[9] = -(*(char *)((long)&parent->i + 1) == local_50.i._1_1_);
        auVar5[10] = -(*(char *)((long)&parent->i + 2) == local_50.i._2_1_);
        auVar5[0xb] = -(*(char *)((long)&parent->i + 3) == local_50.i._3_1_);
        auVar5[0xc] = -(*(char *)((long)&parent->i + 4) == local_50.i._4_1_);
        auVar5[0xd] = -(*(char *)((long)&parent->i + 5) == local_50.i._5_1_);
        auVar5[0xe] = -(*(char *)((long)&parent->i + 6) == local_50.i._6_1_);
        auVar5[0xf] = -(*(char *)((long)&parent->i + 7) == local_50.i._7_1_);
        pQVar1 = (parent->m).ptr;
        auVar6[0] = -((char)pQVar1 == (char)local_50.m.ptr);
        auVar6[1] = -((char)((ulong)pQVar1 >> 8) == (char)((ulong)local_50.m.ptr >> 8));
        auVar6[2] = -((char)((ulong)pQVar1 >> 0x10) == (char)((ulong)local_50.m.ptr >> 0x10));
        auVar6[3] = -((char)((ulong)pQVar1 >> 0x18) == (char)((ulong)local_50.m.ptr >> 0x18));
        auVar6[4] = -((char)((ulong)pQVar1 >> 0x20) == (char)((ulong)local_50.m.ptr >> 0x20));
        auVar6[5] = -((char)((ulong)pQVar1 >> 0x28) == (char)((ulong)local_50.m.ptr >> 0x28));
        auVar6[6] = -((char)((ulong)pQVar1 >> 0x30) == (char)((ulong)local_50.m.ptr >> 0x30));
        auVar6[7] = -((char)((ulong)pQVar1 >> 0x38) == (char)((ulong)local_50.m.ptr >> 0x38));
        auVar6[8] = 0xff;
        auVar6[9] = 0xff;
        auVar6[10] = 0xff;
        auVar6[0xb] = 0xff;
        auVar6[0xc] = 0xff;
        auVar6[0xd] = 0xff;
        auVar6[0xe] = 0xff;
        auVar6[0xf] = 0xff;
        auVar6 = auVar6 & auVar5;
        bVar4 = (ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar6[0xf] >> 7) << 0xf) == 0xffff;
        if (bVar4) {
          if (this_00 == (QAbstractItemView *)this->previewColumn) {
            closeColumns(this,parent,false);
            createColumn(this,parent,true);
          }
          if (bVar4) break;
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < (ulong)(this->columns).d.size);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColumnViewPrivate::checkColumnCreation(const QModelIndex &parent)
{
    if (parent == q_func()->currentIndex() && model->hasChildren(parent)) {
        //the parent has children and is the current
        //let's try to find out if there is already a mapping that is good
        for (int i = 0; i < columns.size(); ++i) {
            QAbstractItemView *view = columns.at(i);
            if (view->rootIndex() == parent) {
                if (view == previewColumn) {
                    //let's recreate the parent
                    closeColumns(parent, false);
                    createColumn(parent, true /*show*/);
                }
                break;
            }
        }
    }
}